

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

double __thiscall r_exec::View::update_res(View *this)

{
  float fVar1;
  double dVar2;
  double dVar3;
  Atom local_1c [4];
  
  fVar1 = (float)r_code::Atom::asFloat();
  dVar3 = (double)fVar1;
  if (fVar1 < INFINITY) {
    if ((this->res_changes != 0) && ((this->acc_res != 0.0 || (NAN(this->acc_res))))) {
      fVar1 = (float)r_code::Atom::asFloat();
      dVar3 = (double)this->acc_res /
              (((double)CONCAT44(0x45300000,(int)(this->res_changes >> 0x20)) -
               1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)this->res_changes) - 4503599627370496.0)) +
              (double)fVar1;
    }
    dVar2 = 0.0;
    if (0.0 <= dVar3 + -1.0) {
      dVar2 = dVar3 + -1.0;
    }
    r_code::Atom::Float((float)dVar2);
    r_code::Atom::operator=((Atom *)&(this->super_View).field_0x38,local_1c);
    r_code::Atom::~Atom(local_1c);
    this->acc_res = 0.0;
    this->res_changes = 0;
    fVar1 = (float)r_code::Atom::asFloat();
    dVar3 = (double)fVar1;
  }
  return dVar3;
}

Assistant:

double View::update_res()
{
    double new_res = get_res();

    if (new_res == std::numeric_limits<double>::infinity()) {
        return new_res;
    }

    if (res_changes > 0 && acc_res != 0) {
        new_res = get_res() + (double)acc_res / (double)res_changes;
    }

    if (--new_res < 0) { // decremented by one on behalf of the group (at upr).
        new_res = 0;
    }

    code(VIEW_RES) = r_code::Atom::Float(new_res);
    acc_res = 0;
    res_changes = 0;
    return get_res();
}